

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k053260.c
# Opt level: O3

void device_reset_k053260(void *chip)

{
  *(undefined4 *)((long)chip + 0x20) = 0;
  *(undefined2 *)((long)chip + 0x24) = 0;
  *(undefined8 *)((long)chip + 0x30) = 0;
  *(undefined8 *)((long)chip + 0x38) = 0;
  *(undefined8 *)((long)chip + 0x3d) = 0;
  *(undefined8 *)((long)chip + 0x45) = 0;
  *(undefined8 *)((long)chip + 0x58) = 0;
  *(undefined8 *)((long)chip + 0x60) = 0;
  *(undefined8 *)((long)chip + 0x65) = 0;
  *(undefined8 *)((long)chip + 0x6d) = 0;
  *(undefined8 *)((long)chip + 0x80) = 0;
  *(undefined8 *)((long)chip + 0x88) = 0;
  *(undefined8 *)((long)chip + 0x8d) = 0;
  *(undefined8 *)((long)chip + 0x95) = 0;
  *(undefined8 *)((long)chip + 0xa8) = 0;
  *(undefined8 *)((long)chip + 0xb0) = 0;
  *(undefined8 *)((long)chip + 0xb5) = 0;
  *(undefined8 *)((long)chip + 0xbd) = 0;
  *(undefined8 *)((long)chip + 0xe0) = 0;
  return;
}

Assistant:

static void device_reset_k053260(void* chip)
{
	k053260_state *info = (k053260_state *)chip;
	int i;

	memset(info->portdata, 0, sizeof(info->portdata));

	info->keyon = 0;
	info->mode = 0;

	for (i = 0; i < 4; i++)
		KDSC_voice_reset(&info->voice[i]);

	RC_RESET(&info->cycleCntr);

	return;
}